

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::MarkArgumentsUsedForBranch(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *this_00;
  _func_int *p_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ArgSlot AVar6;
  undefined4 *puVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  Opnd *pOVar10;
  
  if (instr->m_kind != InstrKindBranch) {
    return;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < ADD) {
    bVar4 = OVar1 == MultiBr || OVar1 == Br;
  }
  else {
    bVar4 = LowererMD::IsUnconditionalBranch(instr);
  }
  if (bVar4 != false) {
    return;
  }
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar4) goto LAB_004496b1;
    *puVar7 = 0;
  }
  pOVar10 = instr->m_src1;
  this_00 = instr->m_src2;
  if (this_00 == (Opnd *)0x0) {
    if (((instr->m_opcode & ~ExtendedOpcodePrefix) == BrFalse_A) &&
       (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 == OpndKindReg)) goto LAB_00449545;
LAB_004495ac:
    pOVar10 = (Opnd *)0x0;
  }
  else {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (((OVar5 == OpndKindIntConst) ||
        ((((OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindInt64Const ||
           (OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindAddr)) ||
          (OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindHelperCall)) ||
         ((OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindFloatConst ||
          (OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindSimd128Const)))))) &&
       (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 == OpndKindReg)) {
LAB_00449545:
      OVar5 = IR::Opnd::GetKind(pOVar10);
      if (OVar5 == OpndKindReg) goto LAB_004495af;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    }
    else {
      if (((this_00 == (Opnd *)0x0) || (OVar5 = IR::Opnd::GetKind(this_00), OVar5 != OpndKindReg))
         || (((OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindIntConst &&
              (((OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindInt64Const &&
                (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindAddr)) &&
               (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindHelperCall)))) &&
             ((OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindFloatConst &&
              (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 != OpndKindSimd128Const))))))
      goto LAB_004495ac;
      OVar5 = IR::Opnd::GetKind(this_00);
      pOVar10 = this_00;
      if (OVar5 == OpndKindReg) goto LAB_004495af;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    }
    if (!bVar4) goto LAB_004496b1;
    *puVar7 = 0;
  }
LAB_004495af:
  if (((pOVar10 != (Opnd *)0x0) &&
      (p_Var2 = pOVar10[1]._vptr_Opnd[5],
      (p_Var2 != (_func_int *)0x0 & *(byte *)(pOVar10[1]._vptr_Opnd + 3)) == 1)) &&
     ((pOVar10 = *(Opnd **)(p_Var2 + 0x48), pOVar10 != (Opnd *)0x0 &&
      (OVar5 = IR::Opnd::GetKind(pOVar10), OVar5 == OpndKindSym)))) {
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) {
LAB_004496b1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    if (*(char *)((long)pOVar10[1]._vptr_Opnd + 0x14) == '\x01') {
      pSVar8 = IR::Opnd::AsSymOpnd(pOVar10);
      pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
      if ((pSVar9->field_0x1a & 0x40) != 0) {
        pSVar8 = IR::Opnd::AsSymOpnd(pOVar10);
        pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
        AVar6 = StackSym::GetParamSlotNum(pSVar9);
        if (AVar6 < 0xd) {
          JITOutput::SetArgUsedForBranch(&this->func->m_output,(uint8)AVar6);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::MarkArgumentsUsedForBranch(IR::Instr * instr)
{
    // If it's a conditional branch instruction and the operand used for branching is one of the arguments
    // to the function, tag the m_argUsedForBranch of the functionBody so that it can be used later for inlining decisions.
    if (instr->IsBranchInstr() && !instr->AsBranchInstr()->IsUnconditional())
    {
        IR::BranchInstr * bInstr = instr->AsBranchInstr();
        IR::Opnd *src1 = bInstr->GetSrc1();
        IR::Opnd *src2 = bInstr->GetSrc2();
        // These are used because we don't want to rely on src1 or src2 to always be the register/constant
        IR::RegOpnd *regOpnd = nullptr;
        if (!src2 && (instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A) && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        // We need to check for (0===arg) and (arg===0); this is especially important since some minifiers
        // change all instances of one to the other.
        else if (src2 && src2->IsConstOpnd() && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        else if (src2 && src2->IsRegOpnd() && src1->IsConstOpnd())
        {
            regOpnd = src2->AsRegOpnd();
        }
        if (regOpnd != nullptr)
        {
            if (regOpnd->m_sym->IsSingleDef())
            {
                IR::Instr * defInst = regOpnd->m_sym->GetInstrDef();
                IR::Opnd *defSym = defInst->GetSrc1();
                if (defSym && defSym->IsSymOpnd() && defSym->AsSymOpnd()->m_sym->IsStackSym()
                    && defSym->AsSymOpnd()->m_sym->AsStackSym()->IsParamSlotSym())
                {
                    uint16 param = defSym->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

                    // We only support functions with 13 arguments to ensure optimal size of callSiteInfo
                    if (param < Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                    {
                        this->func->GetJITOutput()->SetArgUsedForBranch((uint8)param);
                    }
                }
            }
        }
    }
}